

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O0

int __thiscall ncnn::Slice::load_param(Slice *this,ParamDict *pd)

{
  int iVar1;
  Mat *in_RSI;
  long in_RDI;
  Mat *m;
  Mat *this_00;
  Mat *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff64;
  ParamDict *in_stack_ffffffffffffff68;
  
  this_00 = (Mat *)&stack0xffffffffffffff60;
  m = in_RSI;
  ncnn::Mat::Mat(this_00);
  ParamDict::get(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff58);
  ncnn::Mat::operator=(this_00,m);
  ncnn::Mat::~Mat((Mat *)0x5092a8);
  ncnn::Mat::~Mat((Mat *)0x5092b2);
  iVar1 = ParamDict::get((ParamDict *)in_RSI,1,0);
  *(int *)(in_RDI + 0x118) = iVar1;
  return 0;
}

Assistant:

int Slice::load_param(const ParamDict& pd)
{
    slices = pd.get(0, Mat());
    axis = pd.get(1, 0);

    return 0;
}